

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
         *this)

{
  double *pdVar1;
  bool *pbVar2;
  _Rb_tree_node_base *p_Var3;
  ostringstream *poVar4;
  ostream *poVar5;
  Precision PVar6;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar7;
  Statement *pSVar8;
  ShaderExecutor *pSVar9;
  Variable<tcu::Matrix<float,_2,_3>_> *pVVar10;
  pointer pcVar11;
  double dVar12;
  pointer pMVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  _Rb_tree_node_base *p_Var17;
  IVal *pIVar18;
  undefined8 *puVar19;
  bool bVar20;
  Matrix<float,_2,_3> *pMVar21;
  undefined1 *puVar22;
  long lVar23;
  _Base_ptr p_Var24;
  long lVar25;
  _Base_ptr p_Var26;
  FloatFormat *pFVar27;
  TestStatus *pTVar28;
  IVal in2;
  IVal reference1;
  FuncSet funcs;
  IVal in3;
  Environment env;
  IVal in0;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
  outputs;
  FloatFormat highpFmt;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  _Alloc_hider local_5b8;
  undefined1 auStack_5b4 [4];
  Vector<float,_2> VStack_5b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8;
  IVal local_591;
  TestLog *local_590;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
  *local_588;
  size_t local_580;
  FloatFormat *local_578;
  ulong local_570;
  long local_568;
  long local_560;
  undefined1 local_558 [16];
  undefined1 local_548 [24];
  double local_530;
  TestStatus *local_4c8;
  string local_4c0;
  long local_4a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_498;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  double local_448;
  Precision local_440;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_438;
  undefined4 local_430;
  ios_base local_3f8 [8];
  ios_base local_3f0 [264];
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
  local_2e8;
  FloatFormat local_2b8;
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  undefined1 local_1a8 [376];
  
  this_00 = this->m_samplings;
  pFVar27 = &(this->m_caseCtx).floatFormat;
  PVar6 = (this->m_caseCtx).precision;
  sVar7 = (this->m_caseCtx).numRandoms;
  local_4c8 = __return_storage_ptr__;
  iVar15 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_578 = pFVar27;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,3>,tcu::Matrix<float,2,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar27,(FloatFormat *)(ulong)PVar6,(Precision)sVar7,(ulong)(iVar15 + 0xdeadbeef),
             (deUint32)SUB84(local_5b8._M_p,0));
  pMVar13 = local_278.in0.
            super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_580 = ((long)local_278.in0.
                     super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_278.in0.
                     super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>::
  Outputs(&local_2e8,local_580);
  local_2b8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_498._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_498._M_impl.super__Rb_tree_header._M_header;
  local_498._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_498._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_498._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498._M_impl.super__Rb_tree_header._M_header._M_right =
       local_498._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_590 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_2e8.out0.
              super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_280 = local_2e8.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar4 = (ostringstream *)(local_468 + 8);
  local_468._0_8_ = local_590;
  std::__cxx11::ostringstream::ostringstream(poVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var3 = (_Rb_tree_node_base *)(local_558 + 8);
  local_558._8_4_ = _S_red;
  local_548._0_8_ = (_Base_ptr)0x0;
  local_530 = 0.0;
  pSVar8 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_548._8_8_ = p_Var3;
  local_548._16_8_ = p_Var3;
  (*pSVar8->_vptr_Statement[4])(pSVar8,local_558);
  if ((_Rb_tree_node_base *)local_548._8_8_ != p_Var3) {
    p_Var17 = (_Rb_tree_node_base *)local_548._8_8_;
    do {
      (**(code **)(**(long **)(p_Var17 + 1) + 0x30))(*(long **)(p_Var17 + 1),local_1a8);
      p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
    } while (p_Var17 != p_Var3);
  }
  if (local_530 != 0.0) {
    poVar4 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_590;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,local_5b8._M_p,(long)VStack_5b0.m_data);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_p != &local_5a8) {
      operator_delete(local_5b8._M_p,local_5a8._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_3f0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_558);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  pSVar9 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar9->_vptr_ShaderExecutor[2])(pSVar9,local_580,&local_218,&local_288,0);
  tcu::Matrix<tcu::Interval,_2,_3>::Matrix((Matrix<tcu::Interval,_2,_3> *)local_468);
  tcu::Matrix<tcu::Interval,_2,_3>::Matrix((Matrix<tcu::Interval,_2,_3> *)local_1a8);
  tcu::Matrix<tcu::Interval,_2,_3>::Matrix((Matrix<tcu::Interval,_2,_3> *)local_558);
  Environment::bind<tcu::Matrix<float,2,3>>
            ((Environment *)&local_498,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_ptr,
             (IVal *)local_468);
  Environment::bind<tcu::Matrix<float,2,3>>
            ((Environment *)&local_498,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_ptr,
             (IVal *)local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&stack0xfffffffffffffa48);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4c0);
  Environment::bind<tcu::Matrix<float,2,3>>
            ((Environment *)&local_498,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_ptr,
             (IVal *)local_558);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_591);
  if (local_278.in0.
      super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pMVar13) {
LAB_0091496b:
    poVar4 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_590;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"All ",4);
    pTVar28 = local_4c8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_3f0);
    local_468._0_8_ = (IVal *)local_458;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Pass","");
    pTVar28->m_code = QP_TEST_RESULT_PASS;
    (pTVar28->m_description)._M_dataplus._M_p = (pointer)&(pTVar28->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar28->m_description,local_468._0_8_,
               (pointer)(local_468._0_8_ + CONCAT44(local_468._12_4_,local_468._8_4_)));
    if ((IVal *)local_468._0_8_ == (IVal *)local_458) goto LAB_00914b52;
    p_Var24 = (_Base_ptr)CONCAT44(local_458._4_4_,local_458._0_4_);
    pIVar18 = (IVal *)local_468._0_8_;
  }
  else {
    local_4a0 = local_580 + (local_580 == 0);
    local_560 = 0;
    local_568 = 0;
    local_570 = 0;
    pFVar27 = local_578;
    local_588 = this;
    do {
      tcu::Matrix<tcu::Interval,_2,_3>::Matrix((Matrix<tcu::Interval,_2,_3> *)local_1a8);
      local_5b8._M_p = (pointer)0x0;
      VStack_5b0.m_data[0] = 0.0;
      VStack_5b0.m_data[1] = 0.0;
      local_5a8._M_allocated_capacity._0_4_ = 0.0;
      local_5a8._M_allocated_capacity._4_4_ = 0.0;
      lVar23 = 0;
      puVar22 = (undefined1 *)&stack0xfffffffffffffa48;
      bVar14 = true;
      do {
        bVar20 = bVar14;
        lVar25 = 0;
        do {
          *(undefined4 *)(puVar22 + lVar25 * 8) =
               *(undefined4 *)
                ((long)((local_278.in0.
                         super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[lVar25].m_data +
                lVar23 * 4 + local_560);
          lVar25 = lVar25 + 1;
        } while (lVar25 != 3);
        lVar23 = 1;
        puVar22 = auStack_5b4;
        bVar14 = false;
      } while (bVar20);
      ContainerTraits<tcu::Matrix<float,_2,_3>,_tcu::Matrix<tcu::Interval,_2,_3>_>::doRound
                ((IVal *)local_558,pFVar27,(Matrix<float,_2,_3> *)&stack0xfffffffffffffa48);
      ContainerTraits<tcu::Matrix<float,_2,_3>,_tcu::Matrix<tcu::Interval,_2,_3>_>::doConvert
                ((IVal *)local_468,pFVar27,(IVal *)local_558);
      pIVar18 = Environment::lookup<tcu::Matrix<float,2,3>>
                          ((Environment *)&local_498,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>
                           .m_ptr);
      puVar22 = local_468;
      lVar23 = 0;
      bVar14 = true;
      do {
        bVar20 = bVar14;
        lVar25 = 0;
        do {
          *(undefined8 *)((long)&(pIVar18->m_data).m_data[0].m_data[lVar23].m_hi + lVar25) =
               *(undefined8 *)(puVar22 + lVar25 + 0x10);
          dVar12 = *(double *)((long)(puVar22 + lVar25) + 8);
          pbVar2 = &(pIVar18->m_data).m_data[0].m_data[lVar23].m_hasNaN + lVar25;
          *(undefined8 *)pbVar2 = *(undefined8 *)(puVar22 + lVar25);
          *(double *)(pbVar2 + 8) = dVar12;
          lVar25 = lVar25 + 0x30;
        } while (lVar25 != 0x90);
        lVar23 = 1;
        puVar22 = local_458 + 8;
        bVar14 = false;
      } while (bVar20);
      local_5b8._M_p = (pointer)0x0;
      VStack_5b0.m_data[0] = 0.0;
      VStack_5b0.m_data[1] = 0.0;
      local_5a8._M_allocated_capacity._0_4_ = 0.0;
      local_5a8._M_allocated_capacity._4_4_ = 0.0;
      lVar23 = 0;
      puVar22 = (undefined1 *)&stack0xfffffffffffffa48;
      bVar14 = true;
      do {
        bVar20 = bVar14;
        lVar25 = 0;
        do {
          *(undefined4 *)(puVar22 + lVar25 * 8) =
               *(undefined4 *)
                ((long)((local_278.in1.
                         super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[lVar25].m_data +
                lVar23 * 4 + local_560);
          lVar25 = lVar25 + 1;
        } while (lVar25 != 3);
        lVar23 = 1;
        puVar22 = auStack_5b4;
        bVar14 = false;
      } while (bVar20);
      ContainerTraits<tcu::Matrix<float,_2,_3>,_tcu::Matrix<tcu::Interval,_2,_3>_>::doRound
                ((IVal *)local_558,pFVar27,(Matrix<float,_2,_3> *)&stack0xfffffffffffffa48);
      ContainerTraits<tcu::Matrix<float,_2,_3>,_tcu::Matrix<tcu::Interval,_2,_3>_>::doConvert
                ((IVal *)local_468,pFVar27,(IVal *)local_558);
      pIVar18 = Environment::lookup<tcu::Matrix<float,2,3>>
                          ((Environment *)&local_498,
                           (this->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>
                           .m_ptr);
      puVar22 = local_468;
      lVar23 = 0;
      bVar14 = true;
      do {
        bVar20 = bVar14;
        lVar25 = 0;
        do {
          *(undefined8 *)((long)&(pIVar18->m_data).m_data[0].m_data[lVar23].m_hi + lVar25) =
               *(undefined8 *)(puVar22 + lVar25 + 0x10);
          dVar12 = *(double *)((long)(puVar22 + lVar25) + 8);
          pbVar2 = &(pIVar18->m_data).m_data[0].m_data[lVar23].m_hasNaN + lVar25;
          *(undefined8 *)pbVar2 = *(undefined8 *)(puVar22 + lVar25);
          *(double *)(pbVar2 + 8) = dVar12;
          lVar25 = lVar25 + 0x30;
        } while (lVar25 != 0x90);
        lVar23 = 1;
        puVar22 = local_458 + 8;
        bVar14 = false;
      } while (bVar20);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_440 = (this->m_caseCtx).precision;
      local_448 = pFVar27->m_maxValue;
      local_468._0_8_ = *(undefined8 *)pFVar27;
      local_468._8_4_ = pFVar27->m_fractionBits;
      local_468._12_4_ = pFVar27->m_hasSubnormal;
      local_458._0_4_ = pFVar27->m_hasInf;
      local_458._4_4_ = pFVar27->m_hasNaN;
      local_458[8] = pFVar27->m_exactPrecision;
      local_458._9_3_ = *(undefined3 *)&pFVar27->field_0x19;
      local_458._12_4_ = *(undefined4 *)&pFVar27->field_0x1c;
      local_430 = 0;
      pSVar8 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_438 = &local_498;
      (*pSVar8->_vptr_Statement[3])(pSVar8,(IVal *)local_468);
      pIVar18 = Environment::lookup<tcu::Matrix<float,2,3>>
                          ((Environment *)&local_498,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_3>,_tcu::Matrix<tcu::Interval,_2,_3>_>::doConvert
                ((IVal *)local_468,&local_2b8,pIVar18);
      lVar23 = local_568;
      puVar22 = local_1a8;
      pIVar18 = (IVal *)local_468;
      bVar14 = true;
      do {
        bVar20 = bVar14;
        lVar25 = 0;
        do {
          *(undefined8 *)(puVar22 + lVar25 + 0x10) =
               *(undefined8 *)((long)&(pIVar18->m_data).m_data[0].m_data[0].m_hi + lVar25);
          pbVar2 = &(pIVar18->m_data).m_data[0].m_data[0].m_hasNaN + lVar25;
          dVar12 = *(double *)(pbVar2 + 8);
          *(undefined8 *)(puVar22 + lVar25) = *(undefined8 *)pbVar2;
          *(double *)((long)(puVar22 + lVar25) + 8) = dVar12;
          lVar25 = lVar25 + 0x30;
        } while (lVar25 != 0x90);
        puVar22 = local_1a8 + 0x18;
        pIVar18 = (IVal *)(local_458 + 8);
        bVar14 = false;
      } while (bVar20);
      bVar14 = contains<tcu::Matrix<float,2,3>>
                         ((IVal *)local_1a8,
                          local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_568);
      local_468._0_8_ = local_458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Shader output 0 is outside acceptable range","");
      bVar14 = tcu::ResultCollector::check(&local_1f8,bVar14,(string *)local_468);
      if ((TestLog *)local_468._0_8_ != (TestLog *)local_458) {
        operator_delete((void *)local_468._0_8_,CONCAT44(local_458._4_4_,local_458._0_4_) + 1);
      }
      pFVar27 = local_578;
      if ((!bVar14) &&
         (uVar16 = (int)local_570 + 1, local_570 = (ulong)uVar16, this = local_588,
         (int)uVar16 < 0x65)) {
        local_468._0_8_ = local_590;
        poVar4 = (ostringstream *)(local_468 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar4);
        pFVar27 = local_578;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar10 = (local_588->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.
                  m_ptr;
        pMVar21 = (Matrix<float,_2,_3> *)(local_558 + 0x10);
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_558._0_8_ = pMVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_558,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_558._0_8_,
                   CONCAT44(local_558._12_4_,local_558._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        valueToString<tcu::Matrix<float,2,3>>
                  ((string *)&stack0xfffffffffffffa48,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   (local_278.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar23),pMVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),local_5b8._M_p,(long)VStack_5b0.m_data);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b8._M_p != &local_5a8) {
          operator_delete(local_5b8._M_p,local_5a8._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_2,_3> *)local_558._0_8_ != (Matrix<float,_2,_3> *)(local_558 + 0x10)) {
          operator_delete((void *)local_558._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_548._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\t",1);
        pVVar10 = (local_588->m_variables).in1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.
                  m_ptr;
        pMVar21 = (Matrix<float,_2,_3> *)(local_558 + 0x10);
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_558._0_8_ = pMVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_558,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_558._0_8_,
                   CONCAT44(local_558._12_4_,local_558._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        valueToString<tcu::Matrix<float,2,3>>
                  ((string *)&stack0xfffffffffffffa48,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   (local_278.in1.
                    super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar23),pMVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),local_5b8._M_p,(long)VStack_5b0.m_data);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b8._M_p != &local_5a8) {
          operator_delete(local_5b8._M_p,local_5a8._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_2,_3> *)local_558._0_8_ != (Matrix<float,_2,_3> *)(local_558 + 0x10)) {
          operator_delete((void *)local_558._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_548._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\t",1);
        pVVar10 = (local_588->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.
                  m_ptr;
        pIVar18 = (IVal *)(local_558 + 0x10);
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_558._0_8_ = pIVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_558,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_558._0_8_,
                   CONCAT44(local_558._12_4_,local_558._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        valueToString<tcu::Matrix<float,2,3>>
                  ((string *)&stack0xfffffffffffffa48,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   (local_2e8.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar23),
                   (Matrix<float,_2,_3> *)pIVar18);
        poVar5 = (ostream *)(local_468 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_5b8._M_p,(long)VStack_5b0.m_data);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,2,3>>
                  (&local_4c0,(shaderexecutor *)&local_2b8,(FloatFormat *)local_1a8,pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_4c0._M_dataplus._M_p,local_4c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b8._M_p != &local_5a8) {
          operator_delete(local_5b8._M_p,local_5a8._M_allocated_capacity + 1);
        }
        if ((IVal *)local_558._0_8_ != (IVal *)(local_558 + 0x10)) {
          operator_delete((void *)local_558._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_548._0_8_ + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_468 + 8));
        std::ios_base::~ios_base(local_3f0);
        this = local_588;
      }
      local_568 = local_568 + 1;
      local_560 = local_560 + 0x18;
    } while (local_568 != local_4a0);
    iVar15 = (int)local_570;
    if (iVar15 < 0x65) {
      if (iVar15 == 0) goto LAB_0091496b;
    }
    else {
      poVar4 = (ostringstream *)(local_468 + 8);
      local_468._0_8_ = local_590;
      std::__cxx11::ostringstream::ostringstream(poVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"(Skipped ",9);
      std::ostream::operator<<(poVar4,iVar15 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar4);
      std::ios_base::~ios_base(local_3f0);
    }
    poVar4 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_590;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::ostream::operator<<(poVar4,iVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_3f0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
    std::ostream::operator<<(local_468,iVar15);
    pTVar28 = local_4c8;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
    std::ios_base::~ios_base(local_3f8);
    local_468._0_8_ = local_458;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_468," test failed. Check log for the details","");
    p_Var24 = (_Base_ptr)
              (CONCAT44(local_468._12_4_,local_468._8_4_) +
              CONCAT44(local_558._12_4_,local_558._8_4_));
    p_Var26 = (_Base_ptr)0xf;
    if ((IVal *)local_558._0_8_ != (IVal *)(local_558 + 0x10)) {
      p_Var26 = (_Base_ptr)local_548._0_8_;
    }
    if (p_Var26 < p_Var24) {
      p_Var26 = (_Base_ptr)0xf;
      if ((IVal *)local_468._0_8_ != (IVal *)local_458) {
        p_Var26 = (_Base_ptr)CONCAT44(local_458._4_4_,local_458._0_4_);
      }
      if (p_Var26 < p_Var24) goto LAB_0091495c;
      puVar19 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_468,0,(char *)0x0,local_558._0_8_);
    }
    else {
LAB_0091495c:
      puVar19 = (undefined8 *)std::__cxx11::string::_M_append(local_558,local_468._0_8_);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    pdVar1 = (double *)(puVar19 + 2);
    if ((double *)*puVar19 == pdVar1) {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._24_4_ = *(undefined4 *)(puVar19 + 3);
      local_1a8._28_4_ = *(undefined4 *)((long)puVar19 + 0x1c);
    }
    else {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._0_8_ = (double *)*puVar19;
    }
    local_1a8._8_8_ = puVar19[1];
    *puVar19 = pdVar1;
    puVar19[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar28->m_code = QP_TEST_RESULT_FAIL;
    (pTVar28->m_description)._M_dataplus._M_p = (pointer)&(pTVar28->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar28->m_description,local_1a8._0_8_,
               (undefined1 *)(local_1a8._8_8_ + local_1a8._0_8_));
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((IVal *)local_468._0_8_ != (IVal *)local_458) {
      operator_delete((void *)local_468._0_8_,CONCAT44(local_458._4_4_,local_458._0_4_) + 1);
    }
    p_Var24 = (_Base_ptr)local_548._0_8_;
    pIVar18 = (IVal *)local_558._0_8_;
    if ((IVal *)local_558._0_8_ == (IVal *)(local_558 + 0x10)) goto LAB_00914b52;
  }
  operator_delete(pIVar18,(ulong)((long)&p_Var24->_M_color + 1));
LAB_00914b52:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_498);
  if (local_2e8.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.out0.
      super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar28;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}